

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void HFilter16i_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *r0;
  undefined1 auVar3 [16];
  byte bVar4;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  undefined1 auVar5 [16];
  byte bVar20;
  byte bVar22;
  undefined1 auVar21 [16];
  byte bVar23;
  undefined1 auVar24 [16];
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i tmp2;
  __m128i tmp1;
  byte local_58;
  byte bStack_57;
  byte bStack_56;
  byte bStack_55;
  byte bStack_54;
  byte bStack_53;
  byte bStack_52;
  byte bStack_51;
  byte bStack_50;
  byte bStack_4f;
  byte bStack_4e;
  byte bStack_4d;
  byte bStack_4c;
  byte bStack_4b;
  byte bStack_4a;
  byte bStack_49;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  Load16x4_SSE2(p,p + stride * 8,stride,&p3,&p2,&p1,&p0);
  r0 = p + 4;
  iVar2 = -3;
  puVar1 = p + stride * 8;
  while( true ) {
    if (iVar2 == 0) break;
    auVar3._8_8_ = p0[1];
    auVar3._0_8_ = p0[0];
    auVar24._8_8_ = p1[1];
    auVar24._0_8_ = p1[0];
    auVar5 = psubusb(auVar24,auVar3);
    auVar3 = psubusb(auVar3,auVar24);
    auVar3 = auVar3 | auVar5;
    auVar21 = psubusb((undefined1  [16])p2,(undefined1  [16])p3);
    auVar5 = psubusb((undefined1  [16])p3,(undefined1  [16])p2);
    auVar5 = auVar5 | auVar21;
    bVar20 = auVar3[0];
    bVar4 = auVar5[0];
    bVar4 = (bVar4 < bVar20) * bVar20 | (bVar4 >= bVar20) * bVar4;
    bVar20 = auVar3[1];
    bVar6 = auVar5[1];
    bVar6 = (bVar6 < bVar20) * bVar20 | (bVar6 >= bVar20) * bVar6;
    bVar20 = auVar3[2];
    bVar7 = auVar5[2];
    bVar7 = (bVar7 < bVar20) * bVar20 | (bVar7 >= bVar20) * bVar7;
    bVar20 = auVar3[3];
    bVar8 = auVar5[3];
    bVar8 = (bVar8 < bVar20) * bVar20 | (bVar8 >= bVar20) * bVar8;
    bVar20 = auVar3[4];
    bVar9 = auVar5[4];
    bVar9 = (bVar9 < bVar20) * bVar20 | (bVar9 >= bVar20) * bVar9;
    bVar20 = auVar3[5];
    bVar10 = auVar5[5];
    bVar10 = (bVar10 < bVar20) * bVar20 | (bVar10 >= bVar20) * bVar10;
    bVar20 = auVar3[6];
    bVar11 = auVar5[6];
    bVar11 = (bVar11 < bVar20) * bVar20 | (bVar11 >= bVar20) * bVar11;
    bVar20 = auVar3[7];
    bVar12 = auVar5[7];
    bVar12 = (bVar12 < bVar20) * bVar20 | (bVar12 >= bVar20) * bVar12;
    bVar20 = auVar3[8];
    bVar13 = auVar5[8];
    bVar13 = (bVar13 < bVar20) * bVar20 | (bVar13 >= bVar20) * bVar13;
    bVar20 = auVar3[9];
    bVar14 = auVar5[9];
    bVar14 = (bVar14 < bVar20) * bVar20 | (bVar14 >= bVar20) * bVar14;
    bVar20 = auVar3[10];
    bVar15 = auVar5[10];
    bVar15 = (bVar15 < bVar20) * bVar20 | (bVar15 >= bVar20) * bVar15;
    bVar20 = auVar3[0xb];
    bVar16 = auVar5[0xb];
    bVar16 = (bVar16 < bVar20) * bVar20 | (bVar16 >= bVar20) * bVar16;
    bVar20 = auVar3[0xc];
    bVar17 = auVar5[0xc];
    bVar17 = (bVar17 < bVar20) * bVar20 | (bVar17 >= bVar20) * bVar17;
    bVar20 = auVar3[0xd];
    bVar18 = auVar5[0xd];
    bVar18 = (bVar18 < bVar20) * bVar20 | (bVar18 >= bVar20) * bVar18;
    bVar20 = auVar3[0xe];
    bVar19 = auVar5[0xe];
    bVar22 = auVar5[0xf];
    bVar19 = (bVar19 < bVar20) * bVar20 | (bVar19 >= bVar20) * bVar19;
    bVar20 = auVar3[0xf];
    bVar20 = (bVar22 < bVar20) * bVar20 | (bVar22 >= bVar20) * bVar22;
    auVar3 = psubusb(auVar24,(undefined1  [16])p2);
    auVar24 = psubusb((undefined1  [16])p2,auVar24);
    auVar24 = auVar24 | auVar3;
    bVar22 = auVar24[0];
    local_58 = (bVar22 < bVar4) * bVar4 | (bVar22 >= bVar4) * bVar22;
    bVar4 = auVar24[1];
    bStack_57 = (bVar4 < bVar6) * bVar6 | (bVar4 >= bVar6) * bVar4;
    bVar4 = auVar24[2];
    bStack_56 = (bVar4 < bVar7) * bVar7 | (bVar4 >= bVar7) * bVar4;
    bVar4 = auVar24[3];
    bStack_55 = (bVar4 < bVar8) * bVar8 | (bVar4 >= bVar8) * bVar4;
    bVar4 = auVar24[4];
    bStack_54 = (bVar4 < bVar9) * bVar9 | (bVar4 >= bVar9) * bVar4;
    bVar4 = auVar24[5];
    bStack_53 = (bVar4 < bVar10) * bVar10 | (bVar4 >= bVar10) * bVar4;
    bVar4 = auVar24[6];
    bStack_52 = (bVar4 < bVar11) * bVar11 | (bVar4 >= bVar11) * bVar4;
    bVar4 = auVar24[7];
    bStack_51 = (bVar4 < bVar12) * bVar12 | (bVar4 >= bVar12) * bVar4;
    bVar4 = auVar24[8];
    bStack_50 = (bVar4 < bVar13) * bVar13 | (bVar4 >= bVar13) * bVar4;
    bVar4 = auVar24[9];
    bStack_4f = (bVar4 < bVar14) * bVar14 | (bVar4 >= bVar14) * bVar4;
    bVar4 = auVar24[10];
    bStack_4e = (bVar4 < bVar15) * bVar15 | (bVar4 >= bVar15) * bVar4;
    bVar4 = auVar24[0xb];
    bStack_4d = (bVar4 < bVar16) * bVar16 | (bVar4 >= bVar16) * bVar4;
    bVar4 = auVar24[0xc];
    bStack_4c = (bVar4 < bVar17) * bVar17 | (bVar4 >= bVar17) * bVar4;
    bVar4 = auVar24[0xd];
    bStack_4b = (bVar4 < bVar18) * bVar18 | (bVar4 >= bVar18) * bVar4;
    bVar4 = auVar24[0xe];
    bVar6 = auVar24[0xf];
    bStack_4a = (bVar4 < bVar19) * bVar19 | (bVar4 >= bVar19) * bVar4;
    bStack_49 = (bVar6 < bVar20) * bVar20 | (bVar6 >= bVar20) * bVar6;
    local_48 = local_58;
    bStack_47 = bStack_57;
    bStack_46 = bStack_56;
    bStack_45 = bStack_55;
    bStack_44 = bStack_54;
    bStack_43 = bStack_53;
    bStack_42 = bStack_52;
    bStack_41 = bStack_51;
    bStack_40 = bStack_50;
    bStack_3f = bStack_4f;
    bStack_3e = bStack_4e;
    bStack_3d = bStack_4d;
    bStack_3c = bStack_4c;
    bStack_3b = bStack_4b;
    bStack_3a = bStack_4a;
    bStack_39 = bStack_49;
    Load16x4_SSE2(r0,puVar1 + 4,stride,&p3,&p2,&tmp1,&tmp2);
    auVar5._8_8_ = tmp2[1];
    auVar5._0_8_ = tmp2[0];
    auVar21._8_8_ = tmp1[1];
    auVar21._0_8_ = tmp1[0];
    auVar24 = psubusb(auVar21,auVar5);
    auVar3 = psubusb(auVar5,auVar21);
    auVar3 = auVar3 | auVar24;
    auVar5 = psubusb((undefined1  [16])p2,(undefined1  [16])p3);
    auVar24 = psubusb((undefined1  [16])p3,(undefined1  [16])p2);
    auVar24 = auVar24 | auVar5;
    bVar20 = auVar3[0];
    bVar4 = auVar24[0];
    bVar4 = (bVar4 < bVar20) * bVar20 | (bVar4 >= bVar20) * bVar4;
    bVar20 = auVar3[1];
    bVar6 = auVar24[1];
    bVar6 = (bVar6 < bVar20) * bVar20 | (bVar6 >= bVar20) * bVar6;
    bVar20 = auVar3[2];
    bVar7 = auVar24[2];
    bVar7 = (bVar7 < bVar20) * bVar20 | (bVar7 >= bVar20) * bVar7;
    bVar20 = auVar3[3];
    bVar8 = auVar24[3];
    bVar8 = (bVar8 < bVar20) * bVar20 | (bVar8 >= bVar20) * bVar8;
    bVar20 = auVar3[4];
    bVar9 = auVar24[4];
    bVar9 = (bVar9 < bVar20) * bVar20 | (bVar9 >= bVar20) * bVar9;
    bVar20 = auVar3[5];
    bVar10 = auVar24[5];
    bVar10 = (bVar10 < bVar20) * bVar20 | (bVar10 >= bVar20) * bVar10;
    bVar20 = auVar3[6];
    bVar11 = auVar24[6];
    bVar11 = (bVar11 < bVar20) * bVar20 | (bVar11 >= bVar20) * bVar11;
    bVar20 = auVar3[7];
    bVar12 = auVar24[7];
    bVar12 = (bVar12 < bVar20) * bVar20 | (bVar12 >= bVar20) * bVar12;
    bVar20 = auVar3[8];
    bVar13 = auVar24[8];
    bVar13 = (bVar13 < bVar20) * bVar20 | (bVar13 >= bVar20) * bVar13;
    bVar20 = auVar3[9];
    bVar14 = auVar24[9];
    bVar14 = (bVar14 < bVar20) * bVar20 | (bVar14 >= bVar20) * bVar14;
    bVar20 = auVar3[10];
    bVar15 = auVar24[10];
    bVar15 = (bVar15 < bVar20) * bVar20 | (bVar15 >= bVar20) * bVar15;
    bVar20 = auVar3[0xb];
    bVar16 = auVar24[0xb];
    bVar16 = (bVar16 < bVar20) * bVar20 | (bVar16 >= bVar20) * bVar16;
    bVar20 = auVar3[0xc];
    bVar17 = auVar24[0xc];
    bVar17 = (bVar17 < bVar20) * bVar20 | (bVar17 >= bVar20) * bVar17;
    bVar20 = auVar3[0xd];
    bVar18 = auVar24[0xd];
    bVar18 = (bVar18 < bVar20) * bVar20 | (bVar18 >= bVar20) * bVar18;
    bVar20 = auVar3[0xe];
    bVar19 = auVar24[0xe];
    bVar23 = auVar24[0xf];
    bVar22 = (bVar19 < bVar20) * bVar20 | (bVar19 >= bVar20) * bVar19;
    bVar20 = auVar3[0xf];
    bVar23 = (bVar23 < bVar20) * bVar20 | (bVar23 >= bVar20) * bVar23;
    auVar3 = psubusb(auVar21,(undefined1  [16])p2);
    auVar24 = psubusb((undefined1  [16])p2,auVar21);
    auVar24 = auVar24 | auVar3;
    bVar20 = auVar24[0];
    bVar20 = (bVar20 < bVar4) * bVar4 | (bVar20 >= bVar4) * bVar20;
    bVar4 = auVar24[1];
    bVar4 = (bVar4 < bVar6) * bVar6 | (bVar4 >= bVar6) * bVar4;
    bVar6 = auVar24[2];
    bVar6 = (bVar6 < bVar7) * bVar7 | (bVar6 >= bVar7) * bVar6;
    bVar7 = auVar24[3];
    bVar7 = (bVar7 < bVar8) * bVar8 | (bVar7 >= bVar8) * bVar7;
    bVar8 = auVar24[4];
    bVar8 = (bVar8 < bVar9) * bVar9 | (bVar8 >= bVar9) * bVar8;
    bVar9 = auVar24[5];
    bVar9 = (bVar9 < bVar10) * bVar10 | (bVar9 >= bVar10) * bVar9;
    bVar10 = auVar24[6];
    bVar10 = (bVar10 < bVar11) * bVar11 | (bVar10 >= bVar11) * bVar10;
    bVar11 = auVar24[7];
    bVar11 = (bVar11 < bVar12) * bVar12 | (bVar11 >= bVar12) * bVar11;
    bVar12 = auVar24[8];
    bVar12 = (bVar12 < bVar13) * bVar13 | (bVar12 >= bVar13) * bVar12;
    bVar13 = auVar24[9];
    bVar13 = (bVar13 < bVar14) * bVar14 | (bVar13 >= bVar14) * bVar13;
    bVar14 = auVar24[10];
    bVar14 = (bVar14 < bVar15) * bVar15 | (bVar14 >= bVar15) * bVar14;
    bVar15 = auVar24[0xb];
    bVar15 = (bVar15 < bVar16) * bVar16 | (bVar15 >= bVar16) * bVar15;
    bVar16 = auVar24[0xc];
    bVar16 = (bVar16 < bVar17) * bVar17 | (bVar16 >= bVar17) * bVar16;
    bVar17 = auVar24[0xd];
    bVar17 = (bVar17 < bVar18) * bVar18 | (bVar17 >= bVar18) * bVar17;
    bVar18 = auVar24[0xe];
    bVar19 = auVar24[0xf];
    bVar18 = (bVar18 < bVar22) * bVar22 | (bVar18 >= bVar22) * bVar18;
    bVar19 = (bVar19 < bVar23) * bVar23 | (bVar19 >= bVar23) * bVar19;
    local_58 = (bVar20 < local_48) * local_48 | (bVar20 >= local_48) * bVar20;
    bStack_57 = (bVar4 < bStack_47) * bStack_47 | (bVar4 >= bStack_47) * bVar4;
    bStack_56 = (bVar6 < bStack_46) * bStack_46 | (bVar6 >= bStack_46) * bVar6;
    bStack_55 = (bVar7 < bStack_45) * bStack_45 | (bVar7 >= bStack_45) * bVar7;
    bStack_54 = (bVar8 < bStack_44) * bStack_44 | (bVar8 >= bStack_44) * bVar8;
    bStack_53 = (bVar9 < bStack_43) * bStack_43 | (bVar9 >= bStack_43) * bVar9;
    bStack_52 = (bVar10 < bStack_42) * bStack_42 | (bVar10 >= bStack_42) * bVar10;
    bStack_51 = (bVar11 < bStack_41) * bStack_41 | (bVar11 >= bStack_41) * bVar11;
    bStack_50 = (bVar12 < bStack_40) * bStack_40 | (bVar12 >= bStack_40) * bVar12;
    bStack_4f = (bVar13 < bStack_3f) * bStack_3f | (bVar13 >= bStack_3f) * bVar13;
    bStack_4e = (bVar14 < bStack_3e) * bStack_3e | (bVar14 >= bStack_3e) * bVar14;
    bStack_4d = (bVar15 < bStack_3d) * bStack_3d | (bVar15 >= bStack_3d) * bVar15;
    bStack_4c = (bVar16 < bStack_3c) * bStack_3c | (bVar16 >= bStack_3c) * bVar16;
    bStack_4b = (bVar17 < bStack_3b) * bStack_3b | (bVar17 >= bStack_3b) * bVar17;
    bStack_4a = (bVar18 < bStack_3a) * bStack_3a | (bVar18 >= bStack_3a) * bVar18;
    bStack_49 = (bVar19 < bStack_39) * bStack_39 | (bVar19 >= bStack_39) * bVar19;
    ComplexMask_SSE2(&p1,&p0,&p3,&p2,thresh,ithresh,(__m128i *)&local_58);
    DoFilter4_SSE2(&p1,&p0,&p3,&p2,(__m128i *)&local_58,hev_thresh);
    Store16x4_SSE2(&p1,&p0,&p3,&p2,r0 + -2,puVar1 + 2,stride);
    p1[0] = tmp1[0];
    p1[1] = tmp1[1];
    p0[0] = tmp2[0];
    p0[1] = tmp2[1];
    iVar2 = iVar2 + 1;
    r0 = r0 + 4;
    puVar1 = puVar1 + 4;
  }
  return;
}

Assistant:

static void HFilter16i_SSE2(uint8_t* p, int stride,
                            int thresh, int ithresh, int hev_thresh) {
  int k;
  __m128i p3, p2, p1, p0;   // loop invariants

  Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &p1, &p0);  // prologue

  for (k = 3; k > 0; --k) {
    __m128i mask, tmp1, tmp2;
    uint8_t* const b = p + 2;   // beginning of p1

    p += 4;  // beginning of q0 (and next span)

    MAX_DIFF1(p3, p2, p1, p0, mask);   // compute partial mask
    Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &tmp1, &tmp2);
    MAX_DIFF2(p3, p2, tmp1, tmp2, mask);

    ComplexMask_SSE2(&p1, &p0, &p3, &p2, thresh, ithresh, &mask);
    DoFilter4_SSE2(&p1, &p0, &p3, &p2, &mask, hev_thresh);

    Store16x4_SSE2(&p1, &p0, &p3, &p2, b, b + 8 * stride, stride);

    // rotate samples
    p1 = tmp1;
    p0 = tmp2;
  }
}